

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdObjFindOrAdd(If_DsdMan_t *p,int Type,int *pLits,int nLits,word *pTruth)

{
  byte *pbVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *p_00;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  Vec_Int_t *pVVar13;
  void **ppvVar14;
  int *piVar15;
  Gia_Obj_t *pGVar16;
  uint *puVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  size_t __size;
  uint uVar22;
  
  iVar8 = -1;
  iVar9 = -1;
  if (Type == 6) {
    iVar9 = p->vTtMem[nLits]->nEntries;
    iVar8 = Vec_MemHashInsert(p->vTtMem[nLits],pTruth);
  }
  puVar12 = If_DsdObjHashLookup(p,Type,pLits,nLits,iVar8);
  if (*puVar12 != 0) {
    return *puVar12;
  }
  if (((-1 < iVar8) && (p->LutSize != 0)) && (iVar8 == p->vTtDecs[nLits]->nSize)) {
    pVVar13 = Dau_DecFindSets_int(pTruth,nLits,p->pSched);
    if (iVar8 != p->vTtMem[nLits]->nEntries + -1) {
      __assert_fail("truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                    ,0x3ed,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
    }
    pVVar3 = p->vTtDecs[nLits];
    uVar10 = pVVar3->nCap;
    if (pVVar3->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc(0x80);
        }
        else {
          ppvVar14 = (void **)realloc(pVVar3->pArray,0x80);
        }
        pVVar3->pArray = ppvVar14;
        iVar21 = 0x10;
      }
      else {
        iVar21 = uVar10 * 2;
        if (iVar21 <= (int)uVar10) goto LAB_003a1b39;
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc((ulong)uVar10 << 4);
        }
        else {
          ppvVar14 = (void **)realloc(pVVar3->pArray,(ulong)uVar10 << 4);
        }
        pVVar3->pArray = ppvVar14;
      }
      pVVar3->nCap = iVar21;
    }
LAB_003a1b39:
    iVar21 = pVVar3->nSize;
    pVVar3->nSize = iVar21 + 1;
    pVVar3->pArray[iVar21] = pVVar13;
  }
  if ((p->vIsops[nLits] != (Vec_Wec_t *)0x0 && -1 < iVar8) && (iVar9 != p->vTtMem[nLits]->nEntries))
  {
    pVVar13 = Vec_WecPushLevel(p->vIsops[nLits]);
    iVar9 = Kit_TruthIsop((uint *)pTruth,nLits,p->vCover,1);
    if (-1 < iVar9) {
      iVar21 = p->vCover->nSize;
      if ((long)iVar21 < 9) {
        if (pVVar13->nCap < iVar21) {
          __size = (long)iVar21 << 2;
          if (pVVar13->pArray == (int *)0x0) {
            piVar15 = (int *)malloc(__size);
          }
          else {
            piVar15 = (int *)realloc(pVVar13->pArray,__size);
          }
          pVVar13->pArray = piVar15;
          if (piVar15 == (int *)0x0) goto LAB_003a2143;
          pVVar13->nCap = iVar21;
        }
        pVVar4 = p->vCover;
        if (0 < pVVar4->nSize) {
          lVar20 = 0;
          do {
            Vec_IntPush(pVVar13,pVVar4->pArray[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar20 < pVVar4->nSize);
        }
        if (iVar9 != 0) {
          pbVar1 = (byte *)((long)&pVVar13->nCap + 2);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
    }
    if (p->vIsops[nLits]->nSize != p->vTtMem[nLits]->nEntries) {
      __assert_fail("Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits])",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                    ,0x3fc,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
    }
  }
  if ((p->pTtGia != (Gia_Man_t *)0x0 && -1 < iVar8) && (iVar8 == p->vTtMem[nLits]->nEntries + -1)) {
    uVar10 = Kit_TruthToGia(p->pTtGia,(uint *)pTruth,nLits,p->vCover,(Vec_Int_t *)0x0,1);
    if ((int)uVar10 < 0) {
LAB_003a2105:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    p_00 = p->pTtGia;
    uVar22 = uVar10 >> 1;
    uVar11 = p_00->nObjs;
    if ((int)uVar11 <= (int)uVar22) goto LAB_003a2105;
    if ((~*(uint *)(p_00->pObjs + uVar22) & 0x1fffffff) != 0 &&
        (int)*(uint *)(p_00->pObjs + uVar22) < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    uVar2 = p_00->nObjsAlloc;
    if (uVar11 == uVar2) {
      uVar7 = uVar2 * 2;
      if (0x1fffffff < (int)(uVar2 * 2)) {
        uVar7 = 0x20000000;
      }
      if (uVar11 == 0x20000000) {
        puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
        exit(1);
      }
      if ((int)uVar7 <= (int)uVar11) {
        __assert_fail("p->nObjs < nObjNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x25f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
      }
      if (p_00->fVerbose != 0) {
        printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar2,(ulong)uVar7);
      }
      if (p_00->nObjsAlloc < 1) {
        __assert_fail("p->nObjsAlloc > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x262,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
      }
      lVar20 = (long)(int)uVar7;
      if (p_00->pObjs == (Gia_Obj_t *)0x0) {
        pGVar16 = (Gia_Obj_t *)malloc(lVar20 * 0xc);
      }
      else {
        pGVar16 = (Gia_Obj_t *)realloc(p_00->pObjs,lVar20 * 0xc);
      }
      p_00->pObjs = pGVar16;
      memset(pGVar16 + p_00->nObjsAlloc,0,(lVar20 - p_00->nObjsAlloc) * 0xc);
      if (p_00->pMuxes != (uint *)0x0) {
        puVar17 = (uint *)realloc(p_00->pMuxes,lVar20 * 4);
        p_00->pMuxes = puVar17;
        memset(puVar17 + p_00->nObjsAlloc,0,(lVar20 - p_00->nObjsAlloc) * 4);
      }
      p_00->nObjsAlloc = uVar7;
    }
    iVar9 = p_00->nObjs;
    p_00->nObjs = iVar9 + 1;
    if ((long)iVar9 < 0) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar16 = p_00->pObjs + iVar9;
    uVar5 = *(ulong *)pGVar16;
    *(ulong *)pGVar16 = uVar5 | 0x80000000;
    pGVar6 = p_00->pObjs;
    if ((pGVar16 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar16)) {
LAB_003a20e6:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar19 = (ulong)(((uint)((int)pGVar16 - (int)pGVar6) >> 2) * -0x55555555 - uVar22 & 0x1fffffff);
    uVar18 = (ulong)((uVar10 & 1) << 0x1d);
    *(ulong *)pGVar16 = uVar18 | uVar5 & 0xffffffffc0000000 | 0x80000000 | uVar19;
    *(ulong *)pGVar16 =
         uVar18 | uVar5 & 0xe0000000c0000000 | 0x80000000 | uVar19 |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pGVar6 = p_00->pObjs;
    if ((pGVar16 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar16)) goto LAB_003a20e6;
    Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar16 - (long)pGVar6) >> 2) * -0x55555555);
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pGVar16 + -(ulong)((uint)*(undefined8 *)pGVar16 & 0x1fffffff),pGVar16);
    }
    if ((pGVar16 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar16)) goto LAB_003a20e6;
  }
  *puVar12 = (p->vObjs).nSize;
  iVar9 = If_DsdObjCreate(p,Type,pLits,nLits,iVar8);
  if (p->nBins < (p->vObjs).nSize) {
    iVar8 = p->nUniqueMisses;
    uVar10 = p->nBins * 2 - 1;
    while( true ) {
      do {
        uVar22 = uVar10 + 1;
        uVar11 = uVar10 & 1;
        uVar10 = uVar22;
      } while (uVar11 != 0);
      if (uVar22 < 9) break;
      iVar21 = 5;
      while (uVar22 % (iVar21 - 2U) != 0) {
        uVar11 = iVar21 * iVar21;
        iVar21 = iVar21 + 2;
        if (uVar22 < uVar11) goto LAB_003a1f7d;
      }
    }
LAB_003a1f7d:
    p->nBins = uVar22;
    if (p->pBins == (uint *)0x0) {
      puVar12 = (uint *)malloc((long)(int)uVar22 << 2);
    }
    else {
      puVar12 = (uint *)realloc(p->pBins,(long)(int)uVar22 << 2);
    }
    p->pBins = puVar12;
    memset(puVar12,0,(long)p->nBins << 2);
    uVar10 = (p->vObjs).nSize;
    if ((p->vNexts).nCap < (int)uVar10) {
      piVar15 = (p->vNexts).pArray;
      if (piVar15 == (int *)0x0) {
        piVar15 = (int *)malloc((long)(int)uVar10 << 2);
      }
      else {
        piVar15 = (int *)realloc(piVar15,(long)(int)uVar10 << 2);
      }
      (p->vNexts).pArray = piVar15;
      if (piVar15 == (int *)0x0) {
LAB_003a2143:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vNexts).nCap = uVar10;
    }
    if (0 < (int)uVar10) {
      memset((p->vNexts).pArray,0,(ulong)uVar10 * 4);
    }
    (p->vNexts).nSize = uVar10;
    iVar21 = (p->vObjs).nSize;
    if (2 < iVar21) {
      lVar20 = 2;
      do {
        puVar12 = (uint *)(p->vObjs).pArray[lVar20];
        uVar10 = puVar12[1];
        iVar21 = -1;
        if (0x17ffffff < uVar10 && (uVar10 & 7) == 6) {
          uVar11 = *puVar12;
          if (((long)(int)uVar11 < 0) || ((p->vTruths).nSize <= (int)uVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar21 = (p->vTruths).pArray[(int)uVar11];
        }
        puVar17 = If_DsdObjHashLookup(p,uVar10 & 7,(int *)(puVar12 + 2),uVar10 >> 0x1b,iVar21);
        if (*puVar17 != 0) {
          __assert_fail("*pSpot == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                        ,0x3b7,"void If_DsdObjHashResize(If_DsdMan_t *)");
        }
        *puVar17 = *puVar12;
        lVar20 = lVar20 + 1;
        iVar21 = (p->vObjs).nSize;
      } while (lVar20 < iVar21);
    }
    if (p->nUniqueMisses - iVar8 != iVar21 + -2) {
      __assert_fail("p->nUniqueMisses - Prev == Vec_PtrSize(&p->vObjs) - 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                    ,0x3ba,"void If_DsdObjHashResize(If_DsdMan_t *)");
    }
    p->nUniqueMisses = iVar8;
  }
  return iVar9;
}

Assistant:

int If_DsdObjFindOrAdd( If_DsdMan_t * p, int Type, int * pLits, int nLits, word * pTruth )
{
    int PrevSize       = (Type == IF_DSD_PRIME) ? Vec_MemEntryNum( p->vTtMem[nLits] ) : -1;   
    int objId, truthId = (Type == IF_DSD_PRIME) ? Vec_MemHashInsert(p->vTtMem[nLits], pTruth) : -1;
    unsigned * pSpot = If_DsdObjHashLookup( p, Type, pLits, nLits, truthId );
//abctime clk;
    if ( *pSpot )
        return (int)*pSpot;
//clk = Abc_Clock();
    if ( p->LutSize && truthId >= 0 && truthId == Vec_PtrSize(p->vTtDecs[nLits]) )
    {
        Vec_Int_t * vSets = Dau_DecFindSets_int( pTruth, nLits, p->pSched );
        assert( truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 );
        Vec_PtrPush( p->vTtDecs[nLits], vSets );
//        Dau_DecPrintSets( vSets, nLits );
    }
    if ( p->vIsops[nLits] && truthId >= 0 && PrevSize != Vec_MemEntryNum(p->vTtMem[nLits]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vIsops[nLits] );
        int fCompl = Kit_TruthIsop( (unsigned *)pTruth, nLits, p->vCover, 1 );
        if ( fCompl >= 0 && Vec_IntSize(p->vCover) <= 8 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits]) );
    }
    if ( p->pTtGia && truthId >= 0 && truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 )
    {
//        int nObjOld = Gia_ManAndNum(p->pTtGia);
        int Lit = Kit_TruthToGia( p->pTtGia, (unsigned *)pTruth, nLits, p->vCover, NULL, 1 );
//        printf( "%d ", Gia_ManAndNum(p->pTtGia)-nObjOld );
        Gia_ManAppendCo( p->pTtGia, Lit );
    }
//p->timeCheck += Abc_Clock() - clk;
    *pSpot = Vec_PtrSize( &p->vObjs );
    objId = If_DsdObjCreate( p, Type, pLits, nLits, truthId );
    if ( Vec_PtrSize(&p->vObjs) > p->nBins )
        If_DsdObjHashResize( p );
    return objId;
}